

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OneStepDelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OneStepDelaySyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  OneStepDelaySyntax *this_00;
  Token *in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  this_00 = (OneStepDelaySyntax *)
            allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  slang::syntax::OneStepDelaySyntax::OneStepDelaySyntax(this_00,*in_RSI,*in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }